

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

char * filename_cut(char *line,size_t len)

{
  bool bVar1;
  char *local_38;
  char *end;
  char *start;
  char *p;
  size_t len_local;
  char *line_local;
  
  if (line != (char *)0x0) {
    start = line;
    p = (char *)len;
    line_local = line;
    if (len != 0) {
      while( true ) {
        line_local = start;
        bVar1 = false;
        if ((p != (char *)0x0) && (bVar1 = true, *start != ' ')) {
          bVar1 = *start == '\t';
        }
        if (!bVar1) break;
        p = p + -1;
        start = start + 1;
      }
      local_38 = start;
      while( true ) {
        bVar1 = false;
        if (p != (char *)0x0) {
          bVar1 = *start != '\n';
        }
        if (!bVar1) break;
        if ((*start != ' ') && (*start != '\t')) {
          local_38 = start;
        }
        p = p + -1;
        start = start + 1;
      }
      local_38[(int)(uint)(p != (char *)0x0)] = '\0';
    }
    return line_local;
  }
  __assert_fail("line",
                "/workspace/llm4binary/github/license_c_cmakelists/thpatch[P]thtk/thanm.old/thanm.c"
                ,0x397,"char *filename_cut(char *, size_t)");
}

Assistant:

static char*
filename_cut(
    char *line,
    size_t len)
{
    char *p = line;

    assert(line);

    if(len == 0) {
        return line;
    }

    /* isspace(3) is only asking for trouble; we don't parse Unicode anyway. */
#define is_space(c) (c == ' ' || c == '\t')

    while(len > 0 && is_space(*p)) {
        len--;
        p++;
    }

    char *start = p;
    char *end = p;

    while(len > 0 && *p != '\n') {
        if(!is_space(*p)) {
            end = p;
        }
        len--;
        p++;
    }

#undef is_space

    end[len == 0 ? 0 : 1] = '\0';
    return start;
}